

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

int ssa_dead_insn_p(gen_ctx_t gen_ctx,bb_insn_t_conflict bb_insn)

{
  long lVar1;
  MIR_insn_t_conflict insn;
  bool bVar2;
  int iVar3;
  uint uVar4;
  MIR_op_t *pMVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  char *pcVar10;
  size_t unaff_R13;
  int local_64;
  MIR_op_t *local_60;
  ulong local_58;
  bb_insn_t_conflict local_50;
  long local_48;
  undefined1 *local_40;
  gen_ctx_t local_38;
  
  insn = bb_insn->insn;
  iVar7 = (int)*(ulong *)&insn->field_0x18;
  if ((((0xfffffffc < iVar7 - 0xaaU) ||
       ((uVar4 = iVar7 - 0xad, uVar4 < 6 && ((0x2bU >> (uVar4 & 0x1f) & 1) != 0)))) ||
      ((uVar9 = *(ulong *)&insn->field_0x18 >> 0x20, uVar9 != 0 &&
       ((insn->ops[0].field_0x8 == '\x02' && ((insn->ops[0].u.reg & 0xfffffffe) == 4)))))) ||
     (bb_insn->bb->index == 0)) {
    return 0;
  }
  pMVar5 = insn->ops;
  local_40 = &insn->ops[0].field_0x8;
  local_48 = -uVar9;
  uVar6 = 0;
  iVar7 = 0;
  local_60 = pMVar5;
  local_58 = uVar9;
  local_50 = bb_insn;
  local_38 = gen_ctx;
  do {
    bVar2 = true;
    if (uVar6 < uVar9) {
      pcVar10 = local_40 + uVar6 * 0x30;
      lVar1 = local_48 + uVar6;
      lVar8 = 0;
      do {
        unaff_R13 = uVar6 + lVar8;
        MIR_insn_op_mode(local_38->ctx,insn,unaff_R13,&local_64);
        pMVar5 = local_60;
        uVar9 = local_58;
        if ((local_64 != 0) && (*pcVar10 != '\v')) {
          if (*pcVar10 != '\x02') {
            __assert_fail("op_ref->mode == MIR_OP_VAR",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                          ,0x4ff,
                          "int output_insn_var_iterator_next(gen_ctx_t, insn_var_iterator_t *, MIR_reg_t *, int *)"
                         );
          }
          uVar6 = uVar6 + 1 + lVar8;
          bVar2 = false;
          goto LAB_00169c69;
        }
        lVar8 = lVar8 + 1;
        pcVar10 = pcVar10 + 0x30;
      } while (lVar1 + lVar8 != 0);
      unaff_R13 = (size_t)(uint)((int)uVar6 + -1 + (int)lVar8);
      uVar6 = uVar6 + lVar8;
      bVar2 = true;
    }
LAB_00169c69:
    if (bVar2) {
      if (*(int *)&insn->field_0x18 - 0x76U < 0xfffffff8) {
        return iVar7;
      }
      iVar3 = reachable_bo_exists_p((local_50->bb_insn_link).next);
      if (iVar3 != 0) {
        return 0;
      }
      return iVar7;
    }
    if (pMVar5[(int)unaff_R13].field_0x8 == '\v') {
      return 0;
    }
    iVar7 = 1;
    if (pMVar5[(int)unaff_R13].data != (void *)0x0) {
      return 0;
    }
  } while( true );
}

Assistant:

static int ssa_dead_insn_p (gen_ctx_t gen_ctx, bb_insn_t bb_insn) {
  MIR_insn_t insn = bb_insn->insn;
  int op_num, output_exists_p = FALSE;
  MIR_reg_t var;
  insn_var_iterator_t iter;
  ssa_edge_t ssa_edge;

  /* check control insns with possible output: */
  if (MIR_call_code_p (insn->code) || insn->code == MIR_ALLOCA || insn->code == MIR_BSTART
      || insn->code == MIR_VA_START || insn->code == MIR_VA_ARG
      || (insn->nops > 0 && insn->ops[0].mode == MIR_OP_VAR
          && (insn->ops[0].u.var == FP_HARD_REG || insn->ops[0].u.var == SP_HARD_REG)))
    return FALSE;
  if (fake_insn_p (bb_insn)) return FALSE;
  FOREACH_OUT_INSN_VAR (gen_ctx, iter, insn, var, op_num) {
    output_exists_p = TRUE;
    if (insn->ops[op_num].mode == MIR_OP_VAR_MEM || (ssa_edge = insn->ops[op_num].data) != NULL)
      return FALSE;
  }
  if (!MIR_overflow_insn_code_p (insn->code)
      || !reachable_bo_exists_p (DLIST_NEXT (bb_insn_t, bb_insn)))
    return output_exists_p;
  return FALSE;
}